

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::cleanTexture
          (ReadnPixelsTest *this,GLuint texture_id)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_6c;
  undefined1 local_68 [4];
  GLuint i;
  GLubyte pixels [64];
  Functions *gl;
  GLuint texture_id_local;
  ReadnPixelsTest *this_local;
  Functions *gl_00;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  for (local_6c = 0; local_6c < 0x40; local_6c = local_6c + 1) {
    local_68[local_6c] = 0x40;
  }
  RobustnessRobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
  RobustnessRobustBufferAccessBehavior::Texture::SubImage
            (gl_00,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,local_68);
  RobustnessRobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
  return;
}

Assistant:

void ReadnPixelsTest::cleanTexture(glw::GLuint texture_id)
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLubyte pixels[width * height];
	for (GLuint i = 0; i < width * height; ++i)
	{
		pixels[i] = 64;
	}

	Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level  */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, pixels);

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);
}